

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::dense_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
::
serialize<google::sparsehash_internal::pod_serializer<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,StringIO>
          (dense_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::dense_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
           *this,StringIO *param_2)

{
  bool bVar1;
  ulong uVar2;
  int bit;
  long lVar3;
  long lVar4;
  uchar bits;
  byte local_41;
  long local_40;
  string *local_38;
  
  dense_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>(param_2,0x13578642,4);
  if (((bVar1) &&
      (bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x90),8), bVar1)) &&
     (bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x88),8), bVar1)) {
    if (*(long *)(this + 0x90) == 0) {
      return true;
    }
    local_38 = (string *)(this + 0x60);
    lVar4 = 0;
    uVar2 = 0;
    do {
      local_41 = 0;
      lVar3 = 0;
      local_40 = lVar4;
      do {
        if ((uVar2 + lVar3 < *(ulong *)(this + 0x90)) &&
           (bVar1 = Hasher::operator()((Hasher *)(this + 0x30),local_38,
                                       (string *)(*(long *)(this + 0xa8) + lVar4)), !bVar1)) {
          local_41 = local_41 | (byte)(1 << ((byte)lVar3 & 0x1f));
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x40;
      } while (lVar3 != 8);
      std::__cxx11::string::append((char *)param_2->s_,(ulong)&local_41);
      lVar3 = 0;
      lVar4 = local_40;
      do {
        if ((local_41 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
          std::__cxx11::string::append((char *)param_2->s_,*(long *)(this + 0xa8) + lVar4);
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x40;
      } while (lVar3 != 8);
      uVar2 = uVar2 + 8;
      lVar4 = local_40 + 0x200;
    } while (uVar2 < *(ulong *)(this + 0x90));
    return true;
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }